

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O1

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::writeMPS(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,ostream *p_output,NameSet *p_rnames,NameSet *p_cnames,DIdxSet *p_intvars,
          bool writeZeroObjective)

{
  Item *pIVar1;
  uint *puVar2;
  cpp_dec_float<50U,_int,_void> *v;
  pointer pnVar3;
  pointer pnVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar5;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  SPxOut *pSVar6;
  Real a;
  char cVar7;
  uint uVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  undefined4 extraout_var;
  char *pcVar12;
  undefined8 *puVar13;
  uint uVar14;
  char *pcVar15;
  IdxSet *pIVar16;
  char *pcVar17;
  double dVar18;
  cpp_dec_float<50U,_int,_void> *v_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar19;
  cpp_dec_float<50u,int,void> *this_02;
  undefined7 in_register_00000089;
  long lVar20;
  undefined8 uVar21;
  long lVar22;
  uint idx;
  ulong uVar23;
  long in_FS_OFFSET;
  bool bVar24;
  Verbosity old_verbosity;
  char name1 [16];
  char name [16];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  char name2 [16];
  cpp_dec_float<50u,int,void> *pcVar25;
  cpp_dec_float<50U,_int,_void> local_9e8;
  char *local_9a8;
  undefined8 uStack_9a0;
  NameSet *local_990;
  undefined1 local_988 [48];
  char *local_958;
  double local_948;
  undefined8 uStack_940;
  char local_938 [16];
  IdxSet *local_928;
  ulong local_920;
  undefined8 local_918;
  undefined4 local_910;
  uint local_90c;
  char *local_908;
  undefined8 uStack_900;
  undefined1 local_8f8 [48];
  char *local_8c8;
  cpp_dec_float<50U,_int,_void> local_8b8;
  char local_878 [16];
  ulong local_868;
  undefined1 local_860 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_828;
  uint local_7e8 [2];
  uint auStack_7e0 [2];
  uint local_7d8 [2];
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined4 local_790;
  undefined1 local_78c;
  undefined8 local_788;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined4 local_750;
  undefined1 local_74c;
  undefined8 local_748;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined4 local_710;
  undefined1 local_70c;
  undefined8 local_708;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6f8;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined4 local_690;
  undefined1 local_68c;
  undefined8 local_688;
  undefined1 local_678 [64];
  cpp_dec_float<50u,int,void> local_638 [8];
  uint auStack_630 [2];
  uint local_628 [2];
  undefined8 uStack_620;
  undefined8 local_618;
  int local_610;
  byte local_60c;
  char *local_608;
  undefined1 local_5f8 [64];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5b8;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined4 local_550;
  undefined1 local_54c;
  undefined8 local_548;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_538;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_478;
  char local_438 [16];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_428;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3e8;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 uStack_398;
  undefined5 uStack_390;
  undefined3 local_38b;
  undefined5 uStack_388;
  undefined8 uStack_383;
  undefined8 local_378;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 uStack_358;
  undefined5 uStack_350;
  undefined3 local_34b;
  undefined5 uStack_348;
  undefined8 uStack_343;
  undefined8 local_338;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined5 uStack_310;
  undefined3 uStack_30b;
  undefined5 uStack_308;
  undefined8 uStack_303;
  undefined8 local_2f8;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined5 uStack_2d0;
  undefined3 local_2cb;
  undefined5 uStack_2c8;
  undefined8 uStack_2c3;
  undefined8 local_2b8;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined5 uStack_290;
  undefined3 uStack_28b;
  undefined5 uStack_288;
  undefined8 uStack_283;
  undefined8 local_278;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined5 uStack_250;
  undefined3 uStack_24b;
  undefined5 uStack_248;
  undefined8 uStack_243;
  undefined8 local_238;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 uStack_218;
  undefined5 uStack_210;
  undefined3 local_20b;
  undefined5 uStack_208;
  undefined8 uStack_203;
  undefined8 local_1f8;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined5 uStack_1d0;
  undefined3 uStack_1cb;
  undefined5 uStack_1c8;
  undefined8 uStack_1c3;
  undefined8 local_1b8;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined5 uStack_190;
  undefined3 uStack_18b;
  undefined5 uStack_188;
  undefined8 uStack_183;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined5 uStack_150;
  undefined3 uStack_14b;
  undefined5 uStack_148;
  undefined8 uStack_143;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined5 uStack_110;
  undefined3 local_10b;
  undefined5 uStack_108;
  undefined8 uStack_103;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined5 uStack_d0;
  undefined3 uStack_cb;
  undefined5 uStack_c8;
  undefined8 uStack_c3;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined5 uStack_90;
  undefined3 uStack_8b;
  undefined5 uStack_88;
  undefined8 uStack_83;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined5 uStack_50;
  undefined3 uStack_4b;
  undefined5 uStack_48;
  undefined8 uStack_43;
  undefined8 local_38;
  
  local_910 = (undefined4)CONCAT71(in_register_00000089,writeZeroObjective);
  lVar20 = *(long *)p_output;
  *(undefined8 *)(p_output + *(long *)(lVar20 + -0x18) + 8) = 0x10;
  lVar20 = *(long *)(lVar20 + -0x18);
  *(uint *)(p_output + lVar20 + 0x18) = *(uint *)(p_output + lVar20 + 0x18) & 0xfffffefb | 0x100;
  local_990 = p_cnames;
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"NAME          MPSDATA",0x15);
  cVar7 = (char)p_output;
  std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"ROWS",4);
  std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  local_928 = &p_intvars->super_IdxSet;
  if ((this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .set.thenum < 1) {
    local_920 = 0;
  }
  else {
    local_908 = *(char **)(in_FS_OFFSET + -8);
    uStack_900 = 0;
    local_948 = -(double)local_908;
    uStack_940 = 0x8000000000000000;
    pcVar15 = (char *)0x0;
    lVar20 = 0;
    local_920 = 0;
    do {
      pnVar3 = (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_9a8 = pcVar15;
      if (((*(int *)(pcVar15 + (long)&(pnVar3->m_backend).fpclass) == 2) ||
          (pnVar4 = (this->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).right.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          *(int *)(pcVar15 + (long)&(pnVar4->m_backend).fpclass) == 2)) ||
         (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)(pcVar15 + (long)pnVar3),
                              (cpp_dec_float<50U,_int,_void> *)(pcVar15 + (long)pnVar4)),
         iVar10 != 0)) {
        pnVar3 = (this->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ::soplex::infinity::__tls_init();
        local_9e8.fpclass = cpp_dec_float_finite;
        local_9e8.prec_elem = 10;
        local_9e8.data._M_elems._0_16_ = ZEXT816(0);
        local_9e8.data._M_elems[4] = 0;
        local_9e8.data._M_elems[5] = 0;
        local_9e8.data._M_elems._24_5_ = 0;
        local_9e8.data._M_elems[7]._1_3_ = 0;
        local_9e8.data._M_elems._32_5_ = 0;
        local_9e8._37_8_ = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_9e8,local_948);
        if (((*(int *)(local_9a8 + (long)&(pnVar3->m_backend).fpclass) != 2) &&
            (local_9e8.fpclass != cpp_dec_float_NaN)) &&
           (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)(local_9a8 + (long)pnVar3),
                                &local_9e8), 0 < iVar10)) {
          pnVar3 = (this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).right.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_958 = (char *)0xa00000000;
          local_988._0_4_ = 0;
          local_988._4_4_ = 0;
          local_988._8_4_ = 0;
          local_988._12_4_ = 0;
          local_988._16_4_ = 0;
          local_988._20_4_ = 0;
          local_988._24_5_ = 0;
          local_988._29_3_ = 0;
          local_988._32_5_ = 0;
          local_988._37_3_ = 0;
          local_988._40_4_ = 0;
          local_988[0x2c] = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_988,(double)local_908);
          if ((*(int *)(local_9a8 + (long)&(pnVar3->m_backend).fpclass) != 2) &&
             ((fpclass_type)local_958 != cpp_dec_float_NaN)) {
            iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)(local_9a8 + (long)pnVar3),
                                (cpp_dec_float<50U,_int,_void> *)local_988);
            if (iVar10 < 0) {
              local_920 = CONCAT71((int7)(CONCAT44(extraout_var,iVar10) >> 8),1);
              pcVar17 = "E";
              pcVar15 = local_9a8;
              goto LAB_00223c75;
            }
          }
        }
        pnVar3 = (this->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ::soplex::infinity::__tls_init();
        local_9e8.fpclass = cpp_dec_float_finite;
        local_9e8.prec_elem = 10;
        local_9e8.data._M_elems._0_16_ = ZEXT816(0);
        local_9e8.data._M_elems[4] = 0;
        local_9e8.data._M_elems[5] = 0;
        local_9e8.data._M_elems._24_5_ = 0;
        local_9e8.data._M_elems[7]._1_3_ = 0;
        local_9e8.data._M_elems._32_5_ = 0;
        local_9e8._37_8_ = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_9e8,local_948);
        if (((*(int *)(local_9a8 + (long)&(pnVar3->m_backend).fpclass) == 2) ||
            (local_9e8.fpclass == cpp_dec_float_NaN)) ||
           (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)(local_9a8 + (long)pnVar3),
                                &local_9e8), iVar10 < 1)) {
          pnVar3 = (this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).right.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_9e8.fpclass = cpp_dec_float_finite;
          local_9e8.prec_elem = 10;
          local_9e8.data._M_elems._0_16_ = ZEXT816(0);
          local_9e8.data._M_elems[4] = 0;
          local_9e8.data._M_elems[5] = 0;
          local_9e8.data._M_elems._24_5_ = 0;
          local_9e8.data._M_elems[7]._1_3_ = 0;
          local_9e8.data._M_elems._32_5_ = 0;
          local_9e8._37_8_ = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_9e8,(double)local_908);
          pcVar15 = local_9a8;
          if ((*(int *)(local_9a8 + (long)&(pnVar3->m_backend).fpclass) == 2) ||
             (local_9e8.fpclass == cpp_dec_float_NaN)) {
LAB_00225716:
            puVar13 = (undefined8 *)__cxa_allocate_exception(0x28);
            local_9e8.data._M_elems._0_8_ = (undefined1 *)((long)&local_9e8 + 0x10);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_9e8,"XMPSWR02 This should never happen.","");
            *puVar13 = &PTR__SPxException_006a9ee8;
            puVar13[1] = puVar13 + 3;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(puVar13 + 1),local_9e8.data._M_elems._0_8_,
                       (undefined1 *)(local_9e8.data._M_elems._0_8_ + local_9e8.data._M_elems._8_8_)
                      );
            *puVar13 = &PTR__SPxException_006a9ec0;
            __cxa_throw(puVar13,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
          }
          iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)(local_9a8 + (long)pnVar3),&local_9e8
                             );
          pcVar17 = "L";
          if (-1 < iVar10) goto LAB_00225716;
        }
        else {
          pcVar17 = "G";
          pcVar15 = local_9a8;
        }
      }
      else {
        pcVar17 = "E";
        pcVar15 = local_9a8;
      }
LAB_00223c75:
      pcVar12 = MPSgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (this,(int)lVar20,p_rnames,local_878);
      local_3e8.m_backend.fpclass = cpp_dec_float_finite;
      local_3e8.m_backend.prec_elem = 10;
      local_3e8.m_backend.data._M_elems[0] = 0;
      local_3e8.m_backend.data._M_elems[1] = 0;
      local_3e8.m_backend.data._M_elems[2] = 0;
      local_3e8.m_backend.data._M_elems[3] = 0;
      local_3e8.m_backend.data._M_elems[4] = 0;
      local_3e8.m_backend.data._M_elems[5] = 0;
      local_3e8.m_backend.data._M_elems._24_5_ = 0;
      local_3e8.m_backend.data._M_elems[7]._1_3_ = 0;
      local_3e8.m_backend.data._M_elems._32_5_ = 0;
      local_3e8.m_backend._37_8_ = 0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_3e8,0.0);
      local_b8 = 0xa00000000;
      local_e8 = 0;
      uStack_e0 = 0;
      local_d8 = 0;
      uStack_d0 = 0;
      uStack_cb = 0;
      uStack_c8 = 0;
      uStack_c3 = 0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_e8,0.0);
      MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (p_output,pcVar17,pcVar12,(char *)0x0,&local_3e8,(char *)0x0,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_e8);
      lVar20 = lVar20 + 1;
      pcVar15 = pcVar15 + 0x38;
    } while (lVar20 < (this->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum);
  }
  pIVar16 = local_928;
  local_38 = 0xa00000000;
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  uStack_50 = 0;
  uStack_4b = 0;
  uStack_48 = 0;
  uStack_43 = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_68,0.0);
  local_78 = 0xa00000000;
  local_a8 = 0;
  uStack_a0 = 0;
  local_98 = 0;
  uStack_90 = 0;
  uStack_8b = 0;
  uStack_88 = 0;
  uStack_83 = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_a8,0.0);
  MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (p_output,"N","MINIMIZE",(char *)0x0,
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_68,(char *)0x0,
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_a8);
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"COLUMNS",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  if (pIVar16 == (IdxSet *)0x0) {
    uVar21 = 0;
  }
  else {
    uVar21 = CONCAT71((int7)((ulong)&local_68 >> 8),0 < pIVar16->num);
  }
  uVar23 = 0;
  local_918 = uVar21;
  do {
    bVar9 = (bool)((int)uVar23 == 1 & (byte)uVar21);
    local_868 = uVar23;
    if (bVar9 == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                (p_output,"    MARK0001  \'MARKER\'                 \'INTORG\'",0x2f);
      std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + cVar7);
      std::ostream::put(cVar7);
      std::ostream::flush();
    }
    if (0 < (this->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum) {
      dVar18 = 0.0;
      do {
        local_948 = dVar18;
        if ((char)uVar21 == '\0') {
          bVar24 = false;
        }
        else {
          iVar10 = IdxSet::pos(pIVar16,SUB84(dVar18,0));
          bVar24 = -1 < iVar10;
        }
        if (bVar9 == bVar24) {
          pIVar1 = (this->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.theitem +
                   (this->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thekey[(long)local_948].idx;
          iVar10 = (pIVar1->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .memused;
          local_90c = iVar10 - (iVar10 >> 0x1f) & 0xfffffffe;
          if (iVar10 < 2) {
            pcVar15 = (char *)0x0;
            dVar18 = local_948;
          }
          else {
            local_908 = (char *)(ulong)local_90c;
            lVar20 = 0;
            pcVar15 = (char *)0x0;
            dVar18 = local_948;
            do {
              local_9a8 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                    (this,SUB84(dVar18,0),local_990,local_878);
              pcVar17 = MPSgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  (this,*(int *)((long)(&((pIVar1->data).
                                                                                                                    
                                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  .m_elem)->val + 1) + lVar20),p_rnames,local_938);
              pNVar5 = (pIVar1->data).
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem;
              puVar2 = (uint *)((long)(pNVar5->val).m_backend.data._M_elems + lVar20);
              local_478.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar2;
              local_478.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
              puVar2 = (uint *)((long)(pNVar5->val).m_backend.data._M_elems + lVar20 + 0x10);
              local_478.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
              local_478.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
              local_478.m_backend.data._M_elems._32_8_ =
                   *(undefined8 *)((long)(pNVar5->val).m_backend.data._M_elems + lVar20 + 0x20);
              local_478.m_backend.exp = *(int *)((long)(&(pNVar5->val).m_backend.data + 1) + lVar20)
              ;
              local_478.m_backend.neg =
                   *(bool *)((long)(&(pNVar5->val).m_backend.data + 1) + lVar20 + 4);
              local_478.m_backend._48_8_ =
                   *(undefined8 *)((long)(&(pNVar5->val).m_backend.data + 1) + lVar20 + 8);
              pcVar12 = MPSgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  (this,*(int *)((long)(&(pIVar1->data).
                                                                                                                  
                                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  .m_elem[1].val + 1) + lVar20),p_rnames,local_438);
              dVar18 = local_948;
              pNVar5 = (pIVar1->data).
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem;
              puVar2 = (uint *)((long)pNVar5[1].val.m_backend.data._M_elems + lVar20);
              local_4b8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar2;
              local_4b8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
              puVar2 = (uint *)((long)pNVar5[1].val.m_backend.data._M_elems + lVar20 + 0x10);
              local_4b8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
              local_4b8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
              local_4b8.m_backend.data._M_elems._32_8_ =
                   *(undefined8 *)((long)pNVar5[1].val.m_backend.data._M_elems + lVar20 + 0x20);
              local_4b8.m_backend.exp = *(int *)((long)(&pNVar5[1].val.m_backend.data + 1) + lVar20)
              ;
              local_4b8.m_backend.neg =
                   *(bool *)((long)(&pNVar5[1].val.m_backend.data + 1) + lVar20 + 4);
              local_4b8.m_backend._48_8_ =
                   *(undefined8 *)((long)(&pNVar5[1].val.m_backend.data + 1) + lVar20 + 8);
              MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (p_output,(char *)0x0,local_9a8,pcVar17,&local_478,pcVar12,&local_4b8);
              pcVar15 = pcVar15 + 2;
              lVar20 = lVar20 + 0x78;
            } while (pcVar15 < local_908);
          }
          if (local_90c !=
              (pIVar1->data).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused) {
            pcVar17 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (this,SUB84(dVar18,0),local_990,local_878);
            pcVar12 = MPSgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (this,(pIVar1->data).
                                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      .m_elem[(long)pcVar15].idx,p_rnames,local_938);
            pNVar5 = (pIVar1->data).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem;
            local_4f8.m_backend.data._M_elems._0_8_ =
                 *(undefined8 *)&pNVar5[(long)pcVar15].val.m_backend.data;
            local_4f8.m_backend.data._M_elems._8_8_ =
                 *(undefined8 *)(pNVar5[(long)pcVar15].val.m_backend.data._M_elems + 2);
            puVar2 = pNVar5[(long)pcVar15].val.m_backend.data._M_elems + 4;
            local_4f8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            local_4f8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
            local_4f8.m_backend.data._M_elems._32_8_ =
                 *(undefined8 *)(pNVar5[(long)pcVar15].val.m_backend.data._M_elems + 8);
            local_4f8.m_backend.exp = pNVar5[(long)pcVar15].val.m_backend.exp;
            local_4f8.m_backend.neg = pNVar5[(long)pcVar15].val.m_backend.neg;
            local_4f8.m_backend.fpclass = pNVar5[(long)pcVar15].val.m_backend.fpclass;
            local_4f8.m_backend.prec_elem = pNVar5[(long)pcVar15].val.m_backend.prec_elem;
            local_f8 = 0xa00000000;
            uStack_108 = 0;
            uStack_103 = 0;
            uStack_118 = 0;
            uStack_110 = 0;
            local_10b = 0;
            local_128 = 0;
            uStack_120 = 0;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_128,0.0);
            dVar18 = local_948;
            MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (p_output,(char *)0x0,pcVar17,pcVar12,&local_4f8,(char *)0x0,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_128);
          }
          pnVar3 = (this->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).object.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_7c8 = *(undefined8 *)(pnVar3[(long)dVar18].m_backend.data._M_elems + 8);
          local_7e8 = pnVar3[(long)dVar18].m_backend.data._M_elems[0];
          auStack_7e0 = *(uint (*) [2])(pnVar3[(long)dVar18].m_backend.data._M_elems + 2);
          puVar2 = pnVar3[(long)dVar18].m_backend.data._M_elems + 4;
          local_7d8 = *(uint (*) [2])puVar2;
          uStack_7d0 = *(undefined8 *)(puVar2 + 2);
          iVar10 = pnVar3[(long)dVar18].m_backend.exp;
          bVar24 = pnVar3[(long)dVar18].m_backend.neg;
          local_9a8 = *(char **)&pnVar3[(long)dVar18].m_backend.fpclass;
          uStack_9a0 = 0;
          this_00 = (this->_tolerances).
                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          this_01 = (this->_tolerances).
                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_01->_M_use_count = this_01->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_01->_M_use_count = this_01->_M_use_count + 1;
            }
          }
          a = Tolerances::epsilon(this_00);
          local_988._32_5_ = (undefined5)local_7c8;
          local_988._37_3_ = (undefined3)((ulong)local_7c8 >> 0x28);
          local_988._16_4_ = local_7d8[0];
          local_988._20_4_ = local_7d8[1];
          local_988._24_5_ = (undefined5)uStack_7d0;
          local_988._29_3_ = (undefined3)((ulong)uStack_7d0 >> 0x28);
          local_988._0_4_ = local_7e8[0];
          local_988._4_4_ = local_7e8[1];
          uVar21 = local_988._0_8_;
          local_988._8_4_ = auStack_7e0[0];
          local_988._12_4_ = auStack_7e0[1];
          local_958 = local_9a8;
          local_988[0x2c] = bVar24;
          if ((bVar24 != false) &&
             (local_988._0_4_ = local_7e8[0], local_988._0_4_ != 0 || (int)local_9a8 != 0)) {
            local_988[0x2c] = bVar24 ^ 1;
          }
          bVar24 = false;
          local_988._0_8_ = uVar21;
          local_988._40_4_ = iVar10;
          if (((int)local_9a8 != 2) && (!NAN(a))) {
            local_9e8.fpclass = cpp_dec_float_finite;
            local_9e8.prec_elem = 10;
            local_9e8.data._M_elems[0] = 0;
            local_9e8.data._M_elems[1] = 0;
            local_9e8.data._M_elems[2] = 0;
            local_9e8.data._M_elems[3] = 0;
            local_9e8.data._M_elems[4] = 0;
            local_9e8.data._M_elems[5] = 0;
            local_9e8.data._M_elems._24_5_ = 0;
            local_9e8.data._M_elems[7]._1_3_ = 0;
            local_9e8.data._M_elems._32_5_ = 0;
            local_9e8._37_8_ = 0;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_9e8,a);
            iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_988,&local_9e8);
            bVar24 = 0 < iVar10;
          }
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
          }
          pIVar16 = local_928;
          uVar21 = local_918;
          if (bVar24 || (char)local_910 != '\0') {
            pcVar15 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (this,SUB84(local_948,0),local_990,local_878);
            pnVar3 = (this->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).object.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_828.m_backend.data._M_elems._0_8_ =
                 *(undefined8 *)&pnVar3[(long)dVar18].m_backend.data;
            local_828.m_backend.data._M_elems._8_8_ =
                 *(undefined8 *)(pnVar3[(long)dVar18].m_backend.data._M_elems + 2);
            puVar2 = pnVar3[(long)dVar18].m_backend.data._M_elems + 4;
            local_828.m_backend.data._M_elems[4] = *puVar2;
            local_828.m_backend.data._M_elems[5] = puVar2[1];
            local_828.m_backend.data._M_elems[6] = puVar2[2];
            local_828.m_backend.data._M_elems[7] = puVar2[3];
            local_828.m_backend.data._M_elems._32_8_ =
                 *(undefined8 *)(pnVar3[(long)dVar18].m_backend.data._M_elems + 8);
            local_828.m_backend.exp = pnVar3[(long)dVar18].m_backend.exp;
            local_828.m_backend.neg = pnVar3[(long)dVar18].m_backend.neg;
            local_828.m_backend.fpclass = pnVar3[(long)dVar18].m_backend.fpclass;
            local_828.m_backend.prec_elem = pnVar3[(long)dVar18].m_backend.prec_elem;
            if (local_828.m_backend.fpclass != cpp_dec_float_finite ||
                local_828.m_backend.data._M_elems[0] != 0) {
              local_828.m_backend.neg = (bool)(local_828.m_backend.neg ^ 1);
            }
            local_138 = 0xa00000000;
            local_168 = 0;
            uStack_160 = 0;
            local_158 = 0;
            uStack_150 = 0;
            uStack_14b = 0;
            uStack_148 = 0;
            uStack_143 = 0;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_168,0.0);
            MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (p_output,(char *)0x0,pcVar15,"MINIMIZE",&local_828,(char *)0x0,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_168);
            uVar21 = local_918;
          }
        }
        dVar18 = (double)((long)local_948 + 1);
      } while ((long)dVar18 <
               (long)(this->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum);
    }
    if (bVar9 != false) {
      std::__ostream_insert<char,std::char_traits<char>>
                (p_output,"    MARK0001  \'MARKER\'                 \'INTEND\'",0x2f);
      std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + cVar7);
      std::ostream::put(cVar7);
      std::ostream::flush();
    }
    uVar23 = (ulong)((int)local_868 + 1);
  } while (((byte)uVar21 & (int)local_868 == 0) != 0);
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"RHS",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  if (0 < (this->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    uVar23 = 0;
    do {
      local_958 = (char *)0xa00000000;
      local_988._0_4_ = 0;
      local_988._4_4_ = 0;
      local_988._8_4_ = 0;
      local_988._12_4_ = 0;
      local_988._16_4_ = 0;
      local_988._20_4_ = 0;
      local_988._24_5_ = 0;
      local_988._29_3_ = 0;
      local_988._32_5_ = 0;
      local_988._37_3_ = 0;
      local_988._40_4_ = 0;
      local_988[0x2c] = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)local_988,0.0);
      local_8c8 = (char *)0xa00000000;
      local_8f8._0_4_ = 0;
      local_8f8._4_4_ = 0;
      local_8f8._8_4_ = 0;
      local_8f8._12_4_ = 0;
      local_8f8._16_4_ = 0;
      local_8f8._20_4_ = 0;
      local_8f8._24_5_ = 0;
      local_8f8._29_3_ = 0;
      local_8f8._32_5_ = 0;
      local_8f8._37_3_ = 0;
      local_8f8._40_4_ = 0;
      local_8f8[0x2c] = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)local_8f8,0.0);
      if ((int)uVar23 <
          (this->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
        uVar23 = (ulong)(int)uVar23;
        lVar20 = uVar23 * 0x38 + 0x30;
        do {
          pnVar3 = (this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_798 = *(undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar20 + -0x10);
          puVar13 = (undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar20 + -0x30);
          local_7b8 = *puVar13;
          uStack_7b0 = puVar13[1];
          puVar13 = (undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar20 + -0x20);
          local_7a8 = *puVar13;
          uStack_7a0 = puVar13[1];
          local_790 = *(undefined4 *)((long)(pnVar3->m_backend).data._M_elems + lVar20 + -8);
          local_78c = *(undefined1 *)((long)(pnVar3->m_backend).data._M_elems + lVar20 + -4);
          local_788 = *(undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar20);
          pnVar3 = (this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).right.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_538.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar20 + -0x10);
          puVar2 = (uint *)((long)(pnVar3->m_backend).data._M_elems + lVar20 + -0x30);
          local_538.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar2;
          local_538.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
          puVar2 = (uint *)((long)(pnVar3->m_backend).data._M_elems + lVar20 + -0x20);
          local_538.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
          local_538.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
          local_538.m_backend.exp = *(int *)((long)(pnVar3->m_backend).data._M_elems + lVar20 + -8);
          local_538.m_backend.neg = *(bool *)((long)(pnVar3->m_backend).data._M_elems + lVar20 + -4)
          ;
          local_538.m_backend._48_8_ =
               *(undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar20);
          MPSgetRHS<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_860,(soplex *)&local_7b8,&local_538,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)(ulong)CONCAT31((int3)((uint)local_538.m_backend.exp >> 8),
                                        local_538.m_backend.neg));
          local_988._32_5_ = (undefined5)local_860._32_8_;
          local_988._37_3_ = SUB83(local_860._32_8_,5);
          local_988._16_8_ = local_860._16_8_;
          local_988._24_5_ = (undefined5)local_860._24_8_;
          local_988._29_3_ = SUB83(local_860._24_8_,5);
          local_988._0_8_ = local_860._0_8_;
          local_988._8_8_ = local_860._8_8_;
          local_988._40_4_ = local_860._40_4_;
          local_988[0x2c] = local_860[0x2c];
          local_958 = (char *)local_860._48_8_;
          if ((int)local_860._48_8_ == 2) break;
          local_9e8.fpclass = cpp_dec_float_finite;
          local_9e8.prec_elem = 10;
          local_9e8.data._M_elems._0_16_ = ZEXT816(0);
          local_9e8.data._M_elems[4] = 0;
          local_9e8.data._M_elems[5] = 0;
          local_9e8.data._M_elems._24_5_ = 0;
          local_9e8.data._M_elems[7]._1_3_ = 0;
          local_9e8.data._M_elems._32_5_ = 0;
          local_9e8._37_8_ = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_9e8,0.0);
          iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)local_988,&local_9e8);
          if (iVar10 != 0) break;
          uVar23 = uVar23 + 1;
          lVar20 = lVar20 + 0x38;
        } while ((long)uVar23 <
                 (long)(this->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum);
      }
      idx = (uint)uVar23;
      if ((int)idx <
          (this->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
        lVar20 = (long)(int)idx;
        lVar22 = lVar20 * 0x38 + 0x68;
        uVar8 = idx + 2;
        do {
          uVar14 = uVar8;
          lVar20 = lVar20 + 1;
          if ((this->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum <= lVar20) break;
          pnVar3 = (this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_558 = *(undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar22 + -0x10);
          puVar13 = (undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar22 + -0x30);
          local_578 = *puVar13;
          uStack_570 = puVar13[1];
          puVar13 = (undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar22 + -0x20);
          local_568 = *puVar13;
          uStack_560 = puVar13[1];
          local_550 = *(undefined4 *)((long)(pnVar3->m_backend).data._M_elems + lVar22 + -8);
          local_54c = *(undefined1 *)((long)(pnVar3->m_backend).data._M_elems + lVar22 + -4);
          local_548 = *(undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar22);
          pnVar3 = (this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).right.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_5b8.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar22 + -0x10);
          puVar2 = (uint *)((long)(pnVar3->m_backend).data._M_elems + lVar22 + -0x30);
          local_5b8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar2;
          local_5b8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
          puVar2 = (uint *)((long)(pnVar3->m_backend).data._M_elems + lVar22 + -0x20);
          local_5b8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
          local_5b8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
          local_5b8.m_backend.exp = *(int *)((long)(pnVar3->m_backend).data._M_elems + lVar22 + -8);
          local_5b8.m_backend.neg = *(bool *)((long)(pnVar3->m_backend).data._M_elems + lVar22 + -4)
          ;
          local_5b8.m_backend._48_8_ =
               *(undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar22);
          MPSgetRHS<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_860,(soplex *)&local_578,&local_5b8,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)(ulong)CONCAT31((int3)((uint)local_5b8.m_backend.exp >> 8),
                                        local_5b8.m_backend.neg));
          local_8f8._32_5_ = (undefined5)local_860._32_8_;
          local_8f8._37_3_ = SUB83(local_860._32_8_,5);
          local_8f8._16_8_ = local_860._16_8_;
          local_8f8._24_5_ = (undefined5)local_860._24_8_;
          local_8f8._29_3_ = SUB83(local_860._24_8_,5);
          local_8f8._0_8_ = local_860._0_8_;
          local_8f8._8_8_ = local_860._8_8_;
          local_8f8._40_4_ = local_860._40_4_;
          local_8f8[0x2c] = local_860[0x2c];
          local_8c8 = (char *)local_860._48_8_;
          if ((int)local_860._48_8_ == 2) break;
          local_9e8.fpclass = cpp_dec_float_finite;
          local_9e8.prec_elem = 10;
          local_9e8.data._M_elems._0_16_ = ZEXT816(0);
          local_9e8.data._M_elems[4] = 0;
          local_9e8.data._M_elems[5] = 0;
          local_9e8.data._M_elems._24_5_ = 0;
          local_9e8.data._M_elems[7]._1_3_ = 0;
          local_9e8.data._M_elems._32_5_ = 0;
          local_9e8._37_8_ = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_9e8,0.0);
          iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)local_8f8,&local_9e8);
          lVar22 = lVar22 + 0x38;
          uVar8 = uVar14 + 1;
        } while (iVar10 == 0);
        iVar10 = (this->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
        local_9a8 = MPSgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (this,idx,p_rnames,local_938);
        if ((int)(uVar14 - 1) < iVar10) {
          local_5f8._37_3_ = local_988._37_3_;
          local_5f8._32_5_ = local_988._32_5_;
          local_5f8._29_3_ = local_988._29_3_;
          local_5f8._24_5_ = local_988._24_5_;
          local_5f8._16_8_ = local_988._16_8_;
          local_5f8._0_8_ = local_988._0_8_;
          local_5f8._8_8_ = local_988._8_8_;
          local_5f8._40_4_ = local_988._40_4_;
          local_5f8[0x2c] = (bool)local_988[0x2c];
          local_5f8._48_8_ = local_958;
          pcVar15 = MPSgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (this,uVar14 - 1,p_rnames,local_438);
          uStack_620 = CONCAT35(local_8f8._29_3_,local_8f8._24_5_);
          local_638[0] = (cpp_dec_float<50u,int,void>)local_8f8[0];
          local_638[1] = (cpp_dec_float<50u,int,void>)local_8f8[1];
          local_638[2] = (cpp_dec_float<50u,int,void>)local_8f8[2];
          local_638[3] = (cpp_dec_float<50u,int,void>)local_8f8[3];
          local_638[4] = (cpp_dec_float<50u,int,void>)local_8f8[4];
          local_638[5] = (cpp_dec_float<50u,int,void>)local_8f8[5];
          local_638[6] = (cpp_dec_float<50u,int,void>)local_8f8[6];
          local_638[7] = (cpp_dec_float<50u,int,void>)local_8f8[7];
          auStack_630[0] = local_8f8._8_4_;
          auStack_630[1] = local_8f8._12_4_;
          local_628[0] = local_8f8._16_4_;
          local_628[1] = local_8f8._20_4_;
          local_618 = CONCAT35(local_8f8._37_3_,local_8f8._32_5_);
          local_610 = local_8f8._40_4_;
          local_60c = local_8f8[0x2c];
          local_608 = local_8c8;
          pcVar25 = local_638;
          pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)local_5f8;
        }
        else {
          local_678._37_3_ = local_988._37_3_;
          local_678._32_5_ = local_988._32_5_;
          local_678._29_3_ = local_988._29_3_;
          local_678._24_5_ = local_988._24_5_;
          local_678._16_8_ = local_988._16_8_;
          local_678._0_8_ = local_988._0_8_;
          local_678._8_8_ = local_988._8_8_;
          local_678._40_4_ = local_988._40_4_;
          local_678[0x2c] = (bool)local_988[0x2c];
          local_678._48_8_ = local_958;
          local_178 = 0xa00000000;
          local_1a8 = 0;
          uStack_1a0 = 0;
          local_198 = 0;
          uStack_190 = 0;
          uStack_18b = 0;
          uStack_188 = 0;
          uStack_183 = 0;
          pcVar25 = (cpp_dec_float<50u,int,void> *)&local_1a8;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(pcVar25,0.0);
          pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)local_678;
          pcVar15 = (char *)0x0;
        }
        MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (p_output,(char *)0x0,"RHS",local_9a8,pnVar19,pcVar15,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)pcVar25);
        idx = uVar14;
      }
      uVar23 = (ulong)idx;
    } while ((int)idx <
             (this->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum);
  }
  if ((local_920 & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(p_output,"RANGES",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + cVar7);
    std::ostream::put(cVar7);
    std::ostream::flush();
    if (0 < (this->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum) {
      local_948 = *(double *)(in_FS_OFFSET + -8);
      uStack_940 = 0;
      local_9a8 = (char *)((ulong)local_948 ^ 0x8000000000000000);
      uStack_9a0 = 0x8000000000000000;
      lVar22 = 0;
      lVar20 = 0;
      do {
        pnVar3 = (this->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ::soplex::infinity::__tls_init();
        local_9e8.fpclass = cpp_dec_float_finite;
        local_9e8.prec_elem = 10;
        local_9e8.data._M_elems._0_16_ = ZEXT816(0);
        local_9e8.data._M_elems[4] = 0;
        local_9e8.data._M_elems[5] = 0;
        local_9e8.data._M_elems._24_5_ = 0;
        local_9e8.data._M_elems[7]._1_3_ = 0;
        local_9e8.data._M_elems._32_5_ = 0;
        local_9e8._37_8_ = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_9e8,(double)local_9a8);
        if (((*(int *)((long)(&(pnVar3->m_backend).data + 1) + lVar22 + 8U) != 2) &&
            (local_9e8.fpclass != cpp_dec_float_NaN)) &&
           (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)
                                ((long)(pnVar3->m_backend).data._M_elems + lVar22),&local_9e8),
           0 < iVar10)) {
          pnVar3 = (this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).right.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_958 = (char *)0xa00000000;
          local_988._0_4_ = 0;
          local_988._4_4_ = 0;
          local_988._8_4_ = 0;
          local_988._12_4_ = 0;
          local_988._16_4_ = 0;
          local_988._20_4_ = 0;
          local_988._24_5_ = 0;
          local_988._29_3_ = 0;
          local_988._32_5_ = 0;
          local_988._37_3_ = 0;
          local_988._40_4_ = 0;
          local_988[0x2c] = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_988,local_948);
          if (((*(int *)((long)(&(pnVar3->m_backend).data + 1) + lVar22 + 8U) != 2) &&
              ((fpclass_type)local_958 != cpp_dec_float_NaN)) &&
             (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)
                                  ((long)(pnVar3->m_backend).data._M_elems + lVar22),
                                  (cpp_dec_float<50U,_int,_void> *)local_988), iVar10 < 0)) {
            local_908 = MPSgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  (this,(int)lVar20,p_rnames,local_938);
            pnVar3 = (this->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).right.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            v = (cpp_dec_float<50U,_int,_void> *)((long)(pnVar3->m_backend).data._M_elems + lVar22);
            v_00 = (cpp_dec_float<50U,_int,_void> *)
                   ((long)(((this->
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).left.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar22);
            local_8b8.fpclass = cpp_dec_float_finite;
            local_8b8.prec_elem = 10;
            local_8b8.data._M_elems[0] = 0;
            local_8b8.data._M_elems[1] = 0;
            local_8b8.data._M_elems[2] = 0;
            local_8b8.data._M_elems[3] = 0;
            local_8b8.data._M_elems[4] = 0;
            local_8b8.data._M_elems[5] = 0;
            local_8b8.data._M_elems._24_5_ = 0;
            local_8b8.data._M_elems[7]._1_3_ = 0;
            local_8b8.data._M_elems._32_5_ = 0;
            local_8b8.data._M_elems[9]._1_3_ = 0;
            local_8b8.exp = 0;
            local_8b8.neg = false;
            if (v_00 == &local_8b8) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_8b8,v);
              if (local_8b8.data._M_elems[0] != 0 || local_8b8.fpclass != cpp_dec_float_finite) {
                local_8b8.neg = (bool)(local_8b8.neg ^ 1);
              }
            }
            else {
              if (v != &local_8b8) {
                uVar21 = *(undefined8 *)((v->data)._M_elems + 8);
                local_8b8.data._M_elems._32_5_ = SUB85(uVar21,0);
                local_8b8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar21 >> 0x28);
                local_8b8.data._M_elems._0_8_ = *(undefined8 *)(v->data)._M_elems;
                local_8b8.data._M_elems._8_8_ = *(undefined8 *)((v->data)._M_elems + 2);
                local_8b8.data._M_elems._16_8_ = *(undefined8 *)((v->data)._M_elems + 4);
                uVar21 = *(undefined8 *)((v->data)._M_elems + 6);
                local_8b8.data._M_elems._24_5_ = SUB85(uVar21,0);
                local_8b8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar21 >> 0x28);
                local_8b8.exp = *(int *)((long)(&(pnVar3->m_backend).data + 1) + lVar22);
                local_8b8.neg = *(bool *)((long)(&(pnVar3->m_backend).data + 1) + lVar22 + 4U);
                local_8b8._48_8_ =
                     *(undefined8 *)((long)(&(pnVar3->m_backend).data + 1) + lVar22 + 8U);
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_8b8,v_00);
            }
            local_1b8 = 0xa00000000;
            local_1e8 = 0;
            uStack_1e0 = 0;
            local_1d8 = 0;
            uStack_1d0 = 0;
            uStack_1cb = 0;
            uStack_1c8 = 0;
            uStack_1c3 = 0;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_1e8,0.0);
            MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (p_output,"","RANGE",local_908,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_8b8,(char *)0x0,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_1e8);
          }
        }
        lVar20 = lVar20 + 1;
        lVar22 = lVar22 + 0x38;
      } while (lVar20 < (this->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set.thenum);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"BOUNDS",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  if (0 < (this->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    local_948 = *(double *)(in_FS_OFFSET + -8);
    uStack_940 = 0;
    local_9a8 = (char *)((ulong)local_948 ^ 0x8000000000000000);
    uStack_9a0 = 0x8000000000000000;
    lVar22 = 0;
    lVar20 = 0;
    do {
      pnVar3 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar10 = (int)lVar20;
      if (((*(int *)((long)(&(pnVar3->m_backend).data + 1) + lVar22 + 8U) == 2) ||
          (pnVar4 = (this->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          *(int *)((long)(&(pnVar4->m_backend).data + 1) + lVar22 + 8U) == 2)) ||
         (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)
                              ((long)(pnVar3->m_backend).data._M_elems + lVar22),
                              (cpp_dec_float<50U,_int,_void> *)
                              ((long)(pnVar4->m_backend).data._M_elems + lVar22)), iVar11 != 0)) {
        pnVar3 = (this->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).low.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ::soplex::infinity::__tls_init();
        local_9e8.fpclass = cpp_dec_float_finite;
        local_9e8.prec_elem = 10;
        local_9e8.data._M_elems._0_16_ = ZEXT816(0);
        local_9e8.data._M_elems[4] = 0;
        local_9e8.data._M_elems[5] = 0;
        local_9e8.data._M_elems._24_5_ = 0;
        local_9e8.data._M_elems[7]._1_3_ = 0;
        local_9e8.data._M_elems._32_5_ = 0;
        local_9e8._37_8_ = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_9e8,(double)local_9a8);
        pIVar16 = local_928;
        if (((*(int *)((long)(&(pnVar3->m_backend).data + 1) + lVar22 + 8U) != 2) &&
            (local_9e8.fpclass != cpp_dec_float_NaN)) &&
           (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)
                                ((long)(pnVar3->m_backend).data._M_elems + lVar22),&local_9e8),
           iVar11 < 1)) {
          pnVar3 = (this->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).up.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_958 = (char *)0xa00000000;
          local_988._0_4_ = 0;
          local_988._4_4_ = 0;
          local_988._8_4_ = 0;
          local_988._12_4_ = 0;
          local_988._16_4_ = 0;
          local_988._20_4_ = 0;
          local_988._24_5_ = 0;
          local_988._29_3_ = 0;
          local_988._32_5_ = 0;
          local_988._37_3_ = 0;
          local_988._40_4_ = 0;
          local_988[0x2c] = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_988,local_948);
          if (((*(int *)((long)(&(pnVar3->m_backend).data + 1) + lVar22 + 8U) != 2) &&
              ((fpclass_type)local_958 != cpp_dec_float_NaN)) &&
             (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)
                                  ((long)(pnVar3->m_backend).data._M_elems + lVar22),
                                  (cpp_dec_float<50U,_int,_void> *)local_988), -1 < iVar11)) {
            pcVar15 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (this,iVar10,local_990,local_938);
            local_238 = 0xa00000000;
            local_268 = 0;
            uStack_260 = 0;
            local_258 = 0;
            uStack_250 = 0;
            uStack_24b = 0;
            uStack_248 = 0;
            uStack_243 = 0;
            this_02 = (cpp_dec_float<50u,int,void> *)&local_268;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(this_02,0.0);
            local_278 = 0xa00000000;
            local_2a8 = 0;
            uStack_2a0 = 0;
            local_298 = 0;
            uStack_290 = 0;
            uStack_28b = 0;
            uStack_288 = 0;
            uStack_283 = 0;
            pcVar25 = (cpp_dec_float<50u,int,void> *)&local_2a8;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(pcVar25,0.0);
            pcVar17 = "FR";
            goto LAB_0022563a;
          }
        }
        pnVar3 = (this->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).low.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (*(int *)((long)(&(pnVar3->m_backend).data + 1) + lVar22 + 8U) == 2) {
LAB_00224f63:
          pnVar3 = (this->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).low.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_9e8.fpclass = cpp_dec_float_finite;
          local_9e8.prec_elem = 10;
          local_9e8.data._M_elems._0_16_ = ZEXT816(0);
          local_9e8.data._M_elems[4] = 0;
          local_9e8.data._M_elems[5] = 0;
          local_9e8.data._M_elems._24_5_ = 0;
          local_9e8.data._M_elems[7]._1_3_ = 0;
          local_9e8.data._M_elems._32_5_ = 0;
          local_9e8._37_8_ = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_9e8,(double)local_9a8);
          if (((*(int *)((long)(&(pnVar3->m_backend).data + 1) + lVar22 + 8U) == 2) ||
              (local_9e8.fpclass == cpp_dec_float_NaN)) ||
             (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)
                                  ((long)(pnVar3->m_backend).data._M_elems + lVar22),&local_9e8),
             iVar11 < 1)) {
            pcVar15 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (this,iVar10,local_990,local_938);
            local_428.m_backend.fpclass = cpp_dec_float_finite;
            local_428.m_backend.prec_elem = 10;
            local_428.m_backend.data._M_elems[0] = 0;
            local_428.m_backend.data._M_elems[1] = 0;
            local_428.m_backend.data._M_elems[2] = 0;
            local_428.m_backend.data._M_elems[3] = 0;
            local_428.m_backend.data._M_elems[4] = 0;
            local_428.m_backend.data._M_elems[5] = 0;
            local_428.m_backend.data._M_elems._24_5_ = 0;
            local_428.m_backend.data._M_elems[7]._1_3_ = 0;
            local_428.m_backend.data._M_elems._32_5_ = 0;
            local_428.m_backend._37_8_ = 0;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_428,0.0);
            local_2f8 = 0xa00000000;
            local_328 = 0;
            uStack_320 = 0;
            local_318 = 0;
            uStack_310 = 0;
            uStack_30b = 0;
            uStack_308 = 0;
            uStack_303 = 0;
            pcVar25 = (cpp_dec_float<50u,int,void> *)&local_328;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(pcVar25,0.0);
            pcVar17 = "MI";
            pnVar19 = &local_428;
          }
          else {
            pcVar15 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (this,iVar10,local_990,local_938);
            pIVar16 = local_928;
            pnVar3 = (this->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).low.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar2 = (uint *)((long)(pnVar3->m_backend).data._M_elems + lVar22);
            local_6f8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar2;
            local_6f8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
            puVar2 = (uint *)((long)(pnVar3->m_backend).data._M_elems + lVar22 + 0x10);
            local_6f8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            local_6f8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
            local_6f8.m_backend.data._M_elems._32_8_ =
                 *(undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar22 + 0x20);
            local_6f8.m_backend.exp = *(int *)((long)(&(pnVar3->m_backend).data + 1) + lVar22);
            local_6f8.m_backend.neg = *(bool *)((long)(&(pnVar3->m_backend).data + 1) + lVar22 + 4U)
            ;
            local_6f8.m_backend._48_8_ =
                 *(undefined8 *)((long)(&(pnVar3->m_backend).data + 1) + lVar22 + 8U);
            local_2b8 = 0xa00000000;
            uStack_2c8 = 0;
            uStack_2c3 = 0;
            uStack_2d8 = 0;
            uStack_2d0 = 0;
            local_2cb = 0;
            local_2e8 = 0;
            uStack_2e0 = 0;
            pcVar25 = (cpp_dec_float<50u,int,void> *)&local_2e8;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(pcVar25,0.0);
            pcVar17 = "LO";
            pnVar19 = &local_6f8;
          }
          MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (p_output,pcVar17,"BOUND",pcVar15,pnVar19,(char *)0x0,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)pcVar25);
        }
        else {
          local_9e8.fpclass = cpp_dec_float_finite;
          local_9e8.prec_elem = 10;
          local_9e8.data._M_elems._0_16_ = ZEXT816(0);
          local_9e8.data._M_elems[4] = 0;
          local_9e8.data._M_elems[5] = 0;
          local_9e8.data._M_elems._24_5_ = 0;
          local_9e8.data._M_elems[7]._1_3_ = 0;
          local_9e8.data._M_elems._32_5_ = 0;
          local_9e8._37_8_ = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_9e8,0.0);
          iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)
                              ((long)(pnVar3->m_backend).data._M_elems + lVar22),&local_9e8);
          if (iVar11 != 0) goto LAB_00224f63;
        }
        if (((char)local_918 != '\0') && (iVar11 = IdxSet::pos(pIVar16,iVar10), -1 < iVar11)) {
          pcVar15 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (this,iVar10,local_990,local_938);
          pnVar3 = (this->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).up.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar13 = (undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar22);
          local_738 = *puVar13;
          uStack_730 = puVar13[1];
          puVar13 = (undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar22 + 0x10);
          local_728 = *puVar13;
          uStack_720 = puVar13[1];
          local_718 = *(undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar22 + 0x20);
          local_710 = *(undefined4 *)((long)(&(pnVar3->m_backend).data + 1) + lVar22);
          local_70c = *(undefined1 *)((long)(&(pnVar3->m_backend).data + 1) + lVar22 + 4U);
          local_708 = *(undefined8 *)((long)(&(pnVar3->m_backend).data + 1) + lVar22 + 8U);
          local_338 = 0xa00000000;
          uStack_348 = 0;
          uStack_343 = 0;
          uStack_358 = 0;
          uStack_350 = 0;
          local_34b = 0;
          local_368 = 0;
          uStack_360 = 0;
          pcVar25 = (cpp_dec_float<50u,int,void> *)&local_368;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(pcVar25,0.0);
          pcVar17 = "UP";
          this_02 = (cpp_dec_float<50u,int,void> *)&local_738;
          goto LAB_0022563a;
        }
        pnVar3 = (this->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).up.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ::soplex::infinity::__tls_init();
        local_9e8.fpclass = cpp_dec_float_finite;
        local_9e8.prec_elem = 10;
        local_9e8.data._M_elems._0_16_ = ZEXT816(0);
        local_9e8.data._M_elems[4] = 0;
        local_9e8.data._M_elems[5] = 0;
        local_9e8.data._M_elems._24_5_ = 0;
        local_9e8.data._M_elems[7]._1_3_ = 0;
        local_9e8.data._M_elems._32_5_ = 0;
        local_9e8._37_8_ = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_9e8,local_948);
        if (((*(int *)((long)(&(pnVar3->m_backend).data + 1) + lVar22 + 8U) != 2) &&
            (local_9e8.fpclass != cpp_dec_float_NaN)) &&
           (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)
                                ((long)(pnVar3->m_backend).data._M_elems + lVar22),&local_9e8),
           iVar11 < 0)) {
          pcVar15 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (this,iVar10,local_990,local_938);
          pnVar3 = (this->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).up.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar13 = (undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar22);
          local_778 = *puVar13;
          uStack_770 = puVar13[1];
          puVar13 = (undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar22 + 0x10);
          local_768 = *puVar13;
          uStack_760 = puVar13[1];
          local_758 = *(undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar22 + 0x20);
          local_750 = *(undefined4 *)((long)(&(pnVar3->m_backend).data + 1) + lVar22);
          local_74c = *(undefined1 *)((long)(&(pnVar3->m_backend).data + 1) + lVar22 + 4U);
          local_748 = *(undefined8 *)((long)(&(pnVar3->m_backend).data + 1) + lVar22 + 8U);
          local_378 = 0xa00000000;
          uStack_388 = 0;
          uStack_383 = 0;
          uStack_398 = 0;
          uStack_390 = 0;
          local_38b = 0;
          local_3a8 = 0;
          uStack_3a0 = 0;
          pcVar25 = (cpp_dec_float<50u,int,void> *)&local_3a8;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(pcVar25,0.0);
          pcVar17 = "UP";
          this_02 = (cpp_dec_float<50u,int,void> *)&local_778;
          goto LAB_0022563a;
        }
      }
      else {
        pcVar15 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (this,iVar10,local_990,local_938);
        pnVar3 = (this->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).low.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar13 = (undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar22);
        local_6b8 = *puVar13;
        uStack_6b0 = puVar13[1];
        puVar13 = (undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar22 + 0x10);
        local_6a8 = *puVar13;
        uStack_6a0 = puVar13[1];
        local_698 = *(undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar22 + 0x20);
        local_690 = *(undefined4 *)((long)(&(pnVar3->m_backend).data + 1) + lVar22);
        local_68c = *(undefined1 *)((long)(&(pnVar3->m_backend).data + 1) + lVar22 + 4U);
        local_688 = *(undefined8 *)((long)(&(pnVar3->m_backend).data + 1) + lVar22 + 8U);
        local_1f8 = 0xa00000000;
        uStack_208 = 0;
        uStack_203 = 0;
        uStack_218 = 0;
        uStack_210 = 0;
        local_20b = 0;
        local_228 = 0;
        uStack_220 = 0;
        pcVar25 = (cpp_dec_float<50u,int,void> *)&local_228;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(pcVar25,0.0);
        pcVar17 = "FX";
        this_02 = (cpp_dec_float<50u,int,void> *)&local_6b8;
LAB_0022563a:
        MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (p_output,pcVar17,"BOUND",pcVar15,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)this_02,(char *)0x0,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)pcVar25);
      }
      lVar20 = lVar20 + 1;
      lVar22 = lVar22 + 0x38;
    } while (lVar20 < (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum);
  }
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"ENDATA",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  if (((this->thesense == MAXIMIZE) && (pSVar6 = this->spxout, pSVar6 != (SPxOut *)0x0)) &&
     (0 < (int)pSVar6->m_verbosity)) {
    local_9e8.data._M_elems[0] = pSVar6->m_verbosity;
    local_988._0_4_ = 1;
    (*pSVar6->_vptr_SPxOut[2])();
    std::__ostream_insert<char,std::char_traits<char>>
              (this->spxout->m_streams[this->spxout->m_verbosity],
               "XMPSWR03 Warning: objective function inverted when writing maximization problem in MPS file format\n"
               ,99);
    (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_9e8);
  }
  return;
}

Assistant:

inline
void SPxLPBase<R>::writeMPS(
   std::ostream&  p_output,          ///< output stream.
   const NameSet* p_rnames,          ///< row names.
   const NameSet* p_cnames,          ///< column names.
   const DIdxSet* p_intvars,         ///< integer variables.
   const bool     writeZeroObjective ///< write zero objective coefficients
) const
{

   const char*    indicator;
   char           name [16];
   char           name1[16];
   char           name2[16];
   bool           has_ranges = false;
   int            i;
   int            k;

   SPxOut::setScientific(p_output, 16);
   // --- NAME Section ---
   p_output << "NAME          MPSDATA" << std::endl;

   // --- ROWS Section ---
   p_output << "ROWS" << std::endl;

   for(i = 0; i < nRows(); i++)
   {
      if(lhs(i) == rhs(i))
         indicator = "E";
      else if((lhs(i) > R(-infinity)) && (rhs(i) < R(infinity)))
      {
         indicator = "E";
         has_ranges = true;
      }
      else if(lhs(i) > R(-infinity))
         indicator = "G";
      else if(rhs(i) <  R(infinity))
         indicator = "L";
      else
         throw SPxInternalCodeException("XMPSWR02 This should never happen.");

      MPSwriteRecord<R>(p_output, indicator, MPSgetRowName(*this, i, p_rnames, name));
   }

   MPSwriteRecord<R>(p_output, "N", "MINIMIZE");

   // --- COLUMNS Section ---
   p_output << "COLUMNS" << std::endl;

   bool has_intvars = (p_intvars != nullptr) && (p_intvars->size() > 0);

   for(int j = 0; j < (has_intvars ? 2 : 1); j++)
   {
      bool is_intrun = has_intvars && (j == 1);

      if(is_intrun)
         p_output << "    MARK0001  'MARKER'                 'INTORG'" << std::endl;

      for(i = 0; i < nCols(); i++)
      {
         bool is_intvar = has_intvars && (p_intvars->pos(i) >= 0);

         if((is_intrun && !is_intvar) || (!is_intrun &&  is_intvar))
            continue;

         const SVectorBase<R>& col = colVector(i);
         int colsize2 = (col.size() / 2) * 2;

         assert(colsize2 % 2 == 0);

         for(k = 0; k < colsize2; k += 2)
            MPSwriteRecord(p_output, nullptr, getColName(*this, i, p_cnames, name),
                           MPSgetRowName(*this, col.index(k), p_rnames, name1), col.value(k),
                           MPSgetRowName(*this, col.index(k + 1), p_rnames, name2), col.value(k + 1));

         if(colsize2 != col.size())
            MPSwriteRecord(p_output, nullptr, getColName(*this, i, p_cnames, name),
                           MPSgetRowName(*this, col.index(k), p_rnames, name1), col.value(k));

         if(isNotZero(maxObj(i), this->tolerances()->epsilon()) || writeZeroObjective)
            MPSwriteRecord(p_output, nullptr, getColName(*this, i, p_cnames, name), "MINIMIZE", -maxObj(i));
      }

      if(is_intrun)
         p_output << "    MARK0001  'MARKER'                 'INTEND'" << std::endl;
   }

   // --- RHS Section ---
   p_output << "RHS" << std::endl;

   i = 0;

   while(i < nRows())
   {
      R rhsval1 = 0.0;
      R rhsval2 = 0.0;

      for(; i < nRows(); i++)
         if((rhsval1 = MPSgetRHS(lhs(i), rhs(i))) != 0.0)
            break;

      if(i < nRows())
      {
         for(k = i + 1; k < nRows(); k++)
         {
            if((rhsval2 = MPSgetRHS(lhs(k), rhs(k))) != 0.0)
               break;
         }

         if(k < nRows())
         {
            MPSwriteRecord(p_output, nullptr, "RHS", MPSgetRowName(*this, i, p_rnames, name1), rhsval1,
                           MPSgetRowName(*this, k, p_rnames, name2), rhsval2);
         }
         else
            MPSwriteRecord(p_output, nullptr, "RHS", MPSgetRowName(*this, i, p_rnames, name1), rhsval1);

         i = k + 1;
      }
   }

   // --- RANGES Section ---
   if(has_ranges)
   {
      p_output << "RANGES" << std::endl;

      for(i = 0; i < nRows(); i++)
      {
         if((lhs(i) > R(-infinity)) && (rhs(i) < R(infinity)))
            MPSwriteRecord(p_output, "", "RANGE", MPSgetRowName(*this, i, p_rnames, name1), rhs(i) - lhs(i));
      }
   }

   // --- BOUNDS Section ---
   p_output << "BOUNDS" << std::endl;

   for(i = 0; i < nCols(); i++)
   {
      if(lower(i) == upper(i))
      {
         MPSwriteRecord(p_output, "FX", "BOUND", getColName(*this, i, p_cnames, name1), lower(i));
         continue;
      }

      if((lower(i) <= R(-infinity)) && (upper(i) >= R(infinity)))
      {
         MPSwriteRecord<R>(p_output, "FR", "BOUND", getColName(*this, i, p_cnames, name1));
         continue;
      }

      if(lower(i) != 0.0)
      {
         if(lower(i) > R(-infinity))
            MPSwriteRecord(p_output, "LO", "BOUND", getColName(*this, i, p_cnames, name1), lower(i));
         else
            MPSwriteRecord<R>(p_output, "MI", "BOUND", getColName(*this, i, p_cnames, name1));
      }

      if(has_intvars && (p_intvars->pos(i) >= 0))
      {
         // Integer variables have default upper bound 1.0, but we should write
         // it nevertheless since CPLEX seems to assume R(infinity) otherwise.
         MPSwriteRecord(p_output, "UP", "BOUND", getColName(*this, i, p_cnames, name1), upper(i));
      }
      else
      {
         // Continous variables have default upper bound R(infinity)
         if(upper(i) < R(infinity))
            MPSwriteRecord(p_output, "UP", "BOUND", getColName(*this, i, p_cnames, name1), upper(i));
      }
   }

   // --- ENDATA Section ---
   p_output << "ENDATA" << std::endl;

   // Output warning when writing a maximisation problem
   if(spxSense() == SPxLPBase<R>::MAXIMIZE)
   {
      SPX_MSG_WARNING((*spxout), (*spxout) <<
                      "XMPSWR03 Warning: objective function inverted when writing maximization problem in MPS file format\n");
   }
}